

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_page_operator.c
# Opt level: O1

HPDF_STATUS HPDF_Page_ShowText(HPDF_Page page,char *text)

{
  HPDF_PageAttr attr;
  HPDF_STATUS HVar1;
  HPDF_REAL HVar2;
  
  HVar1 = HPDF_Page_CheckState(page,4);
  if ((text != (char *)0x0 && HVar1 == 0) && (*text != '\0')) {
    attr = (HPDF_PageAttr)page->attr;
    if (attr->gstate->font == (HPDF_Font)0x0) {
      HVar1 = HPDF_RaiseError(page->error,0x104e,0);
      return HVar1;
    }
    HVar2 = HPDF_Page_TextWidth(page,text);
    if ((HVar2 != 0.0) || (NAN(HVar2))) {
      HVar1 = InternalWriteText(attr,text);
      if (HVar1 != 0) {
LAB_0012cf07:
        HVar1 = HPDF_CheckError(page->error);
        return HVar1;
      }
      HVar1 = HPDF_Stream_WriteStr(attr->stream," Tj\n");
      if (HVar1 != 0) goto LAB_0012cf07;
      if (attr->gstate->writing_mode == HPDF_WMODE_HORIZONTAL) {
        (attr->text_pos).x = (attr->text_matrix).a * HVar2 + (attr->text_pos).x;
        (attr->text_pos).y = HVar2 * (attr->text_matrix).b + (attr->text_pos).y;
      }
      else {
        (attr->text_pos).x = (attr->text_pos).x - (attr->text_matrix).b * HVar2;
        (attr->text_pos).y = (attr->text_pos).y - HVar2 * (attr->text_matrix).a;
      }
    }
    HVar1 = 0;
  }
  return HVar1;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_Page_ShowText  (HPDF_Page    page,
                     const char  *text)
{
    HPDF_STATUS ret = HPDF_Page_CheckState (page, HPDF_GMODE_TEXT_OBJECT);
    HPDF_PageAttr attr;
    HPDF_REAL tw;

    HPDF_PTRACE ((" HPDF_Page_ShowText\n"));

    if (ret != HPDF_OK || text == NULL || text[0] == 0)
        return ret;

    attr = (HPDF_PageAttr)page->attr;

    /* no font exists */
    if (!attr->gstate->font)
        return HPDF_RaiseError (page->error, HPDF_PAGE_FONT_NOT_FOUND, 0);

    tw = HPDF_Page_TextWidth (page, text);
    if (!tw)
        return ret;

    if (InternalWriteText (attr, text) != HPDF_OK)
        return HPDF_CheckError (page->error);

    if (HPDF_Stream_WriteStr (attr->stream, " Tj\012") != HPDF_OK)
        return HPDF_CheckError (page->error);

    /* calculate the reference point of text */
    if (attr->gstate->writing_mode == HPDF_WMODE_HORIZONTAL) {
        attr->text_pos.x += tw * attr->text_matrix.a;
        attr->text_pos.y += tw * attr->text_matrix.b;
    } else {
        attr->text_pos.x -= tw * attr->text_matrix.b;
        attr->text_pos.y -= tw * attr->text_matrix.a;
    }

    return ret;
}